

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O3

void printf_buf(TextBuffer *buf,char *format,...)

{
  char c;
  byte bVar1;
  ravitype_t tt;
  char in_AL;
  void **ppvVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char tbuf [128];
  undefined8 local_188;
  void **local_180;
  void *local_168 [4];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  char local_b8 [136];
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_180 = &ap[0].overflow_arg_area;
  local_b8[0x40] = '\0';
  local_b8[0x41] = '\0';
  local_b8[0x42] = '\0';
  local_b8[0x43] = '\0';
  local_b8[0x44] = '\0';
  local_b8[0x45] = '\0';
  local_b8[0x46] = '\0';
  local_b8[0x47] = '\0';
  local_b8[0x48] = '\0';
  local_b8[0x49] = '\0';
  local_b8[0x4a] = '\0';
  local_b8[0x4b] = '\0';
  local_b8[0x4c] = '\0';
  local_b8[0x4d] = '\0';
  local_b8[0x4e] = '\0';
  local_b8[0x4f] = '\0';
  local_b8[0x50] = '\0';
  local_b8[0x51] = '\0';
  local_b8[0x52] = '\0';
  local_b8[0x53] = '\0';
  local_b8[0x54] = '\0';
  local_b8[0x55] = '\0';
  local_b8[0x56] = '\0';
  local_b8[0x57] = '\0';
  local_b8[0x58] = '\0';
  local_b8[0x59] = '\0';
  local_b8[0x5a] = '\0';
  local_b8[0x5b] = '\0';
  local_b8[0x5c] = '\0';
  local_b8[0x5d] = '\0';
  local_b8[0x5e] = '\0';
  local_b8[0x5f] = '\0';
  local_b8[0x60] = '\0';
  local_b8[0x61] = '\0';
  local_b8[0x62] = '\0';
  local_b8[99] = '\0';
  local_b8[100] = '\0';
  local_b8[0x65] = '\0';
  local_b8[0x66] = '\0';
  local_b8[0x67] = '\0';
  local_b8[0x68] = '\0';
  local_b8[0x69] = '\0';
  local_b8[0x6a] = '\0';
  local_b8[0x6b] = '\0';
  local_b8[0x6c] = '\0';
  local_b8[0x6d] = '\0';
  local_b8[0x6e] = '\0';
  local_b8[0x6f] = '\0';
  local_b8[0x70] = '\0';
  local_b8[0x71] = '\0';
  local_b8[0x72] = '\0';
  local_b8[0x73] = '\0';
  local_b8[0x74] = '\0';
  local_b8[0x75] = '\0';
  local_b8[0x76] = '\0';
  local_b8[0x77] = '\0';
  local_b8[0x78] = '\0';
  local_b8[0x79] = '\0';
  local_b8[0x7a] = '\0';
  local_b8[0x7b] = '\0';
  local_b8[0x7c] = '\0';
  local_b8[0x7d] = '\0';
  local_b8[0x7e] = '\0';
  local_b8[0x7f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_188 = 0x3000000010;
  local_168[2] = (void *)in_RDX;
  local_168[3] = (void *)in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  do {
    c = *format;
    if (c != '%') {
      if (c == '\0') {
        return;
      }
      goto switchD_00114bbc_caseD_64;
    }
    bVar1 = format[1];
    pcVar6 = format + 1;
    if (bVar1 < 0x70) {
      switch(bVar1) {
      case 0x62:
        uVar5 = local_188 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        raviX_buffer_add_bool(buf,*ppvVar2 != (void *)0x0);
        break;
      case 99:
        uVar5 = local_188 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        pvVar3 = *ppvVar2;
        pcVar4 = "--%s";
LAB_00114e51:
        raviX_buffer_add_fstring(buf,pcVar4,pvVar3);
        break;
      case 0x66:
        uVar5 = (ulong)local_188._4_4_;
        if (uVar5 < 0xa1) {
          local_188 = CONCAT44(local_188._4_4_ + 0x10,(int)local_188);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        raviX_buffer_add_double(buf,(double)*ppvVar2);
        break;
      case 0x69:
        uVar5 = local_188 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        raviX_buffer_add_longlong(buf,(int64_t)*ppvVar2);
        break;
      default:
        if (bVar1 == 0x50) {
          uVar5 = local_188 & 0xffffffff;
          if (uVar5 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
            ppvVar2 = (void **)((long)local_168 + uVar5);
          }
          else {
            ppvVar2 = local_180;
            local_180 = local_180 + 1;
          }
          pvVar3 = *ppvVar2;
          pcVar4 = "%lld";
          goto LAB_00114e51;
        }
        if (bVar1 == 0x54) {
          uVar5 = local_188 & 0xffffffff;
          if (uVar5 < 0x29) {
            local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
            ppvVar2 = (void **)((long)local_168 + uVar5);
          }
          else {
            ppvVar2 = local_180;
            local_180 = local_180 + 1;
          }
          tt = **ppvVar2;
          if (tt == RAVI_TUSERDATA) {
            pvVar3 = *(void **)((long)*ppvVar2 + 8);
            if (pvVar3 != (void *)0x0) goto LAB_00114e15;
            pcVar4 = "userdata";
          }
          else {
            pcVar4 = raviX_get_type_name(tt);
          }
          goto LAB_00114e1c;
        }
      case 100:
      case 0x65:
      case 0x67:
      case 0x68:
switchD_00114bbc_caseD_64:
        raviX_buffer_add_char(buf,c);
        pcVar6 = format;
      }
    }
    else {
      if (bVar1 == 0x74) {
        uVar5 = local_188 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        pvVar3 = *ppvVar2;
LAB_00114e15:
        pcVar4 = *(char **)((long)pvVar3 + 0x10);
      }
      else if (bVar1 == 0x73) {
        uVar5 = local_188 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        pcVar4 = (char *)*ppvVar2;
      }
      else {
        if (bVar1 != 0x70) goto switchD_00114bbc_caseD_64;
        uVar5 = local_188 & 0xffffffff;
        if (uVar5 < 0x29) {
          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 8);
          ppvVar2 = (void **)((long)local_168 + uVar5);
        }
        else {
          ppvVar2 = local_180;
          local_180 = local_180 + 1;
        }
        snprintf(local_b8,0x80,"%.*s",(ulong)*(uint *)ppvVar2,
                 "                                                                                ")
        ;
        pcVar4 = local_b8;
      }
LAB_00114e1c:
      raviX_buffer_add_string(buf,pcVar4);
    }
    format = pcVar6 + 1;
  } while( true );
}

Assistant:

static void printf_buf(TextBuffer *buf, const char *format, ...)
{
	static const char *PADDING = "                                                                                ";
	char tbuf[128] = {0};
	va_list ap;
	const char *cp;
	va_start(ap, format);
	for (cp = format; *cp; cp++) {
		if (cp[0] == '%' && cp[1] == 'p') { /* padding */
			int level = va_arg(ap, int);
			snprintf(tbuf, sizeof tbuf, "%.*s", level, PADDING);
			raviX_buffer_add_string(buf, tbuf);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 't') { /* string_object */
			const StringObject *s = va_arg(ap, const StringObject *);
			raviX_buffer_add_string(buf, s->str);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'T') { /* VariableType */
			const VariableType *type;
			type = va_arg(ap, const VariableType *);
			if (type->type_code == RAVI_TUSERDATA) {
				const StringObject *s = type->type_name;
				if (s != NULL)
					raviX_buffer_add_string(buf, s->str);
				else
					raviX_buffer_add_string(buf, "userdata");
			} else {
				raviX_buffer_add_string(buf, raviX_get_type_name(type->type_code));
			}
			cp++;
		} else if (cp[0] == '%' && cp[1] == 's') { /* const char * */
			const char *s;
			s = va_arg(ap, const char *);
			raviX_buffer_add_string(buf, s);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'c') { /* comment */
			const char *s;
			s = va_arg(ap, const char *);
			raviX_buffer_add_fstring(buf, "--%s", s);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'i') { /* integer */
			lua_Integer i;
			i = va_arg(ap, lua_Integer);
			raviX_buffer_add_longlong(buf, i);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'f') { /* float */
			double d;
			d = va_arg(ap, double);
			raviX_buffer_add_double(buf, d);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'b') { /* boolean */
			lua_Integer i;
			i = va_arg(ap, lua_Integer);
			raviX_buffer_add_bool(buf, i != 0);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'P') { /* pointer */
			void *p;
			p = va_arg(ap, void *);
			raviX_buffer_add_fstring(buf, "%lld", (intptr_t)p);
			cp++;
		} else {
			raviX_buffer_add_char(buf, *cp);
		}
	}
	va_end(ap);
}